

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O2

void web_server_destroy(void)

{
  if (bWebServerState == WEB_SERVER_ENABLED) {
    membuffer_destroy(&gDocumentRootDir);
    membuffer_destroy(&gWebserverCorsString);
    alias_release(&gAliasDoc);
    pthread_mutex_lock((pthread_mutex_t *)&gWebMutex);
    gAliasDoc.name.buf = (char *)0x0;
    gAliasDoc.name.length = 0;
    gAliasDoc.name.capacity = 0;
    gAliasDoc.name.size_inc = 0;
    gAliasDoc.doc.buf = (char *)0x0;
    gAliasDoc.doc.length = 0;
    gAliasDoc.doc.capacity = 0;
    gAliasDoc.doc.size_inc = 0;
    gAliasDoc.last_modified = 0;
    gAliasDoc.ct = (int *)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)&gWebMutex);
    pthread_mutex_destroy((pthread_mutex_t *)&gWebMutex);
    bWebServerState = WEB_SERVER_DISABLED;
  }
  return;
}

Assistant:

void web_server_destroy(void)
{
	if (bWebServerState == WEB_SERVER_ENABLED) {
		membuffer_destroy(&gDocumentRootDir);
		membuffer_destroy(&gWebserverCorsString);
		alias_release(&gAliasDoc);

		ithread_mutex_lock(&gWebMutex);
		memset(&gAliasDoc, 0, sizeof(struct xml_alias_t));
		ithread_mutex_unlock(&gWebMutex);

		ithread_mutex_destroy(&gWebMutex);
		bWebServerState = WEB_SERVER_DISABLED;
	}
}